

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

typed_option<unsigned_long> * __thiscall
VW::config::options_i::get_typed_option<unsigned_long>(options_i *this,string *key)

{
  size_t sVar1;
  element_type *peVar2;
  size_t sVar3;
  bad_cast *this_00;
  typed_option<unsigned_long> *ptVar4;
  undefined8 in_RSI;
  long *in_RDI;
  base_option *base;
  __shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffc0;
  undefined1 local_28 [16];
  element_type *local_18;
  
  (**(code **)(*in_RDI + 0x20))(local_28,in_RDI,in_RSI);
  peVar2 = std::
           __shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*(in_stack_ffffffffffffffc0);
  std::shared_ptr<VW::config::base_option>::~shared_ptr
            ((shared_ptr<VW::config::base_option> *)0x168d5c);
  sVar1 = peVar2->m_type_hash;
  local_18 = peVar2;
  sVar3 = typed_option<unsigned_long>::type_hash();
  if (sVar1 != sVar3) {
    this_00 = (bad_cast *)__cxa_allocate_exception(8);
    std::bad_cast::bad_cast(this_00);
    __cxa_throw(this_00,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  ptVar4 = (typed_option<unsigned_long> *)
           __dynamic_cast(local_18,&config::base_option::typeinfo,
                          &typed_option<unsigned_long>::typeinfo,0);
  if (ptVar4 == (typed_option<unsigned_long> *)0x0) {
    __cxa_bad_cast();
  }
  return ptVar4;
}

Assistant:

typed_option<T>& get_typed_option(const std::string& key)
  {
    base_option& base = *get_option(key);
    if (base.m_type_hash != typed_option<T>::type_hash())
    {
      throw std::bad_cast();
    }

    return dynamic_cast<typed_option<T>&>(base);
  }